

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,yaml_event_t *event,int empty)

{
  yaml_parser_state_t **top;
  int iVar1;
  yaml_token_t *pyVar2;
  yaml_parser_state_t *pyVar3;
  
  if (((parser->token_available == 0) && (iVar1 = yaml_parser_fetch_more_tokens(parser), iVar1 == 0)
      ) || (pyVar2 = (parser->tokens).head, pyVar2 == (yaml_token_t *)0x0)) {
    return 0;
  }
  if ((empty == 0) && (pyVar2->type == YAML_VALUE_TOKEN)) {
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = 0;
    (parser->tokens).head = pyVar2 + 1;
    iVar1 = yaml_parser_fetch_more_tokens(parser);
    if (iVar1 == 0) {
      return 0;
    }
    pyVar2 = (parser->tokens).head;
    if (pyVar2 == (yaml_token_t *)0x0) {
      return 0;
    }
    if ((pyVar2->type | YAML_STREAM_END_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
      pyVar3 = (parser->states).top;
      if (pyVar3 == (parser->states).end) {
        top = &(parser->states).top;
        iVar1 = yaml_stack_extend(&(parser->states).start,top,&(parser->states).end);
        if (iVar1 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar3 = *top;
      }
      (parser->states).top = pyVar3 + 1;
      *pyVar3 = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
      iVar1 = yaml_parser_parse_node(parser,event,0,0);
      return iVar1;
    }
  }
  parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
  iVar1 = yaml_parser_process_empty_scalar(parser,event,pyVar2->start_mark);
  return iVar1;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,
        yaml_event_t *event, int empty)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (empty) {
        parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        return yaml_parser_process_empty_scalar(parser, event,
                token->start_mark);
    }

    if (token->type == YAML_VALUE_TOKEN) {
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_FLOW_ENTRY_TOKEN
                && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_KEY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    return yaml_parser_process_empty_scalar(parser, event, token->start_mark);
}